

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot-file.c
# Opt level: O1

int faup_snapshot_file_unzip(char *zipfile)

{
  int iVar1;
  mz_uint mVar2;
  mz_bool mVar3;
  mz_bool mVar4;
  mz_uint mVar5;
  char *url_snapshot_file;
  mz_zip_archive zip_archive;
  mz_zip_archive_file_stat file_stat;
  char *local_500;
  mz_zip_archive local_4f8;
  mz_zip_archive_file_stat local_488;
  
  local_500 = (char *)0x0;
  iVar1 = asprintf(&local_500,"%s.urls",zipfile);
  if (iVar1 < 0) {
    faup_snapshot_file_unzip_cold_3();
LAB_00118541:
    iVar1 = -1;
  }
  else {
    local_4f8.m_pIO_opaque = (void *)0x0;
    local_4f8.m_pState = (mz_zip_internal_state *)0x0;
    local_4f8.m_pWrite = (mz_file_write_func)0x0;
    local_4f8.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
    local_4f8.m_pAlloc_opaque = (void *)0x0;
    local_4f8.m_pRead = (mz_file_read_func)0x0;
    local_4f8.m_pFree = (mz_free_func)0x0;
    local_4f8.m_pRealloc = (mz_realloc_func)0x0;
    local_4f8.m_file_offset_alignment = 0;
    local_4f8.m_pAlloc = (mz_alloc_func)0x0;
    local_4f8.m_total_files = 0;
    local_4f8.m_zip_mode = MZ_ZIP_MODE_INVALID;
    local_4f8.m_zip_type = MZ_ZIP_TYPE_INVALID;
    local_4f8.m_last_error = MZ_ZIP_NO_ERROR;
    local_4f8.m_archive_size = 0;
    local_4f8.m_central_directory_file_ofs = 0;
    iVar1 = 0;
    mz_zip_reader_init_file(&local_4f8,local_500,0);
    mVar2 = mz_zip_reader_get_num_files(&local_4f8);
    if (0 < (int)mVar2) {
      mVar2 = 0;
      do {
        mVar3 = mz_zip_reader_file_stat(&local_4f8,mVar2,&local_488);
        if (mVar3 == 0) {
          faup_snapshot_file_unzip_cold_2();
        }
        else {
          faup_utils_recursive_mkdir(local_488.m_filename);
          mVar4 = mz_zip_reader_extract_to_file(&local_4f8,mVar2,local_488.m_filename,0);
          if (mVar4 == 0) {
            faup_snapshot_file_unzip_cold_1();
          }
        }
        if (mVar3 == 0) goto LAB_00118541;
        mVar2 = mVar2 + 1;
        mVar5 = mz_zip_reader_get_num_files(&local_4f8);
      } while ((int)mVar2 < (int)mVar5);
    }
    mz_zip_reader_end(&local_4f8);
    free(local_500);
  }
  return iVar1;
}

Assistant:

int faup_snapshot_file_unzip(char *zipfile)
{

  char *url_snapshot_file = NULL;
  size_t zipfile_len;
  int retval;

  mz_zip_archive zip_archive;
  mz_bool status;
  int i;

  retval = asprintf(&url_snapshot_file, "%s.urls", zipfile);
  if (retval < 0) {
    fprintf(stderr, "Error: cannot concatenate snapshot file with zip file!\n");
    return -1;
  }

  memset(&zip_archive, 0, sizeof(zip_archive));
  status = mz_zip_reader_init_file(&zip_archive, url_snapshot_file, 0);
  for (i = 0; i < (int)mz_zip_reader_get_num_files(&zip_archive); i++) {
    mz_zip_archive_file_stat file_stat;

    if (!mz_zip_reader_file_stat(&zip_archive, i, &file_stat)) {
      fprintf(stderr, "Cannot stat the zip file!\n");
      mz_zip_reader_end(&zip_archive);
      return -1;
    }

    faup_utils_recursive_mkdir(file_stat.m_filename);

    status = mz_zip_reader_extract_to_file(&zip_archive, i, file_stat.m_filename, 0);
    if (!status) {
      fprintf(stderr, "Error extracting '%s': %s\n", file_stat.m_filename, strerror(errno));
    }
  }

  mz_zip_reader_end(&zip_archive);

  free(url_snapshot_file);

  return 0;
}